

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::Option::ignore_case<CLI::App>(Option *this,bool value)

{
  pointer puVar1;
  Option *this_00;
  bool bVar2;
  OptionAlreadyAdded *this_01;
  pointer puVar3;
  string local_40;
  
  (this->super_OptionBase<CLI::Option>).ignore_case_ = value;
  puVar3 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar1) {
      return this;
    }
    this_00 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (this_00 != this) {
      bVar2 = operator==(this_00,this);
      if (bVar2) {
        this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        get_name_abi_cxx11_(&local_40,
                            (puVar3->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,true,true);
        OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_40);
        __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
    }
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

Option *ignore_case(bool value = true) {
        ignore_case_ = value;
        auto *parent = dynamic_cast<T *>(parent_);

        for(const Option_p &opt : parent->options_)
            if(opt.get() != this && *opt == *this)
                throw OptionAlreadyAdded(opt->get_name(true, true));

        return this;
    }